

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_filter.hpp
# Opt level: O0

bool __thiscall
jsoncons::
json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
::visit_string(json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
               *this,string_view_type *value,semantic_tag tag,ser_context *context,error_code *ec)

{
  error_code ec_00;
  byte bVar1;
  const_pointer pvVar2;
  error_code *this_00;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *pjVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  ser_error *in_RDI;
  type tVar4;
  type result;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> target;
  ser_context *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  conv_flags in_stack_ffffffffffffff3c;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  wstring *this_01;
  wstring local_48 [56];
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  semantic_tag tag_00;
  
  this_01 = local_48;
  local_10 = in_RSI;
  std::__cxx11::wstring::wstring(this_01);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(local_10);
  std::basic_string_view<char,_std::char_traits<char>_>::size(local_10);
  tVar4 = unicode_traits::convert<char,std::__cxx11::wstring>
                    ((char *)in_RDI,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff3c);
  if (tVar4.ec != success) {
    this_00 = (error_code *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::unicode_traits::conv_errc,void>
              (this_00,in_stack_ffffffffffffff3c);
    ec_00._M_cat = (error_category *)this_01;
    ec_00._0_8_ = pvVar2;
    ser_error::ser_error(in_RDI,ec_00);
    __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
  }
  pjVar3 = json_visitor_adaptor_base<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>_>
           ::destination((json_visitor_adaptor_base<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>_>
                          *)in_RDI);
  tag_00 = (semantic_tag)((ulong)pjVar3 >> 0x38);
  std::__cxx11::wstring::operator_cast_to_basic_string_view(local_48);
  bVar1 = basic_json_visitor<wchar_t>::string_value
                    ((basic_json_visitor<wchar_t> *)in_stack_ffffffffffffff40,
                     (string_view_type *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),tag_00,
                     in_stack_ffffffffffffff28,(error_code *)0x37e184);
  std::__cxx11::wstring::~wstring(local_48);
  return (bool)(bVar1 & 1);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& value,
        semantic_tag tag,
        const ser_context& context,
        std::error_code& ec) override
    {
        std::basic_string<typename To::char_type> target;
        auto result = unicode_traits::convert(value.data(), value.size(),
                                              target,unicode_traits::conv_flags::strict);
        if (result.ec != unicode_traits::conv_errc())
        {
            JSONCONS_THROW(ser_error(result.ec));
        }
        return destination().string_value(target, tag, context, ec);
    }